

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateMemberAccess(ExpressionContext *ctx,SynBase *source,ExprBase *value,SynIdentifier *member,
                  bool allowFailure)

{
  undefined8 uVar1;
  Allocator *pAVar2;
  FunctionData *pFVar3;
  TypeFunction *pTVar4;
  TypeHandle *pTVar5;
  TypeHandle *pTVar6;
  char *pcVar7;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  FunctionLookupChain chain_01;
  FunctionLookupChain chain_02;
  FunctionLookupChain chain_03;
  FunctionLookupChain chain_04;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  ExprGetAddress *pEVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SynBase *source_00;
  VariableData *pVVar15;
  undefined4 extraout_var_03;
  _func_int **pp_Var16;
  undefined4 extraout_var_05;
  ExprBase *pEVar17;
  undefined4 extraout_var_06;
  TypeBase *pTVar18;
  long lVar19;
  long lVar20;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ExprBase *pEVar21;
  undefined4 extraout_var_11;
  TypeUnsizedArray *pTVar22;
  TypeRef *pTVar23;
  ExprGetAddress *pEVar24;
  FunctionHandle *pFVar25;
  TypeFunctionSet *pTVar26;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TypeBase *pTVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long *plVar31;
  TypeClass *parent;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> overloads;
  FunctionLookupChain function_5;
  FunctionLookupChain function_4;
  FunctionLookupChain function_3;
  FunctionLookupChain function_1;
  FunctionLookupChain function_2;
  FunctionLookupChain function;
  SmallArray<TypeBase_*,_16U> types;
  SmallArray<FunctionValue,_32U> functions;
  IntrusiveList<FunctionHandle> local_488;
  FunctionLookupChain local_470;
  FunctionLookupChain local_458;
  FunctionLookupChain local_440;
  FunctionLookupChain local_428;
  FunctionLookupChain local_410;
  FunctionLookupChain local_3f8;
  SmallArray<TypeBase_*,_16U> local_3e0;
  undefined1 local_348 [8];
  FunctionData *local_340;
  SynBase local_338 [12];
  Allocator *local_38;
  ExprGetAddress *pEVar13;
  VariableHandle *variable;
  undefined4 extraout_var_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_12;
  
  pTVar27 = value->type;
  pEVar24 = (ExprGetAddress *)value;
  if ((pTVar27 == (TypeBase *)0x0) || (pTVar27->typeID != 0x12)) {
    pEVar14 = (ExprGetAddress *)value;
    if (value->typeID == 0x16) {
      pEVar24 = (ExprGetAddress *)value[1]._vptr_ExprBase;
    }
    else if (value->typeID == 0x22) {
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pTVar23 = ExpressionContext::GetReferenceType(ctx,value->type);
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_02,iVar10);
      pVVar15 = (VariableData *)value[1]._vptr_ExprBase;
      variable->source = value->source;
      variable->variable = pVVar15;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var_01,iVar9),source,&pTVar23->super_TypeBase,
                 variable);
      pEVar24 = (ExprGetAddress *)CONCAT44(extraout_var_01,iVar9);
    }
    else if ((pTVar27 == (TypeBase *)0x0) || (pTVar27->typeID != 0x12)) {
      bVar8 = AssertValueExpression(ctx,source,value);
      if (!bVar8) goto LAB_0016b627;
      source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pVVar15 = anon_unknown.dwarf_c3752::AllocateTemporary(ctx,source_00,value->type);
      pEVar17 = CreateVariableAccess(ctx,source_00,pVVar15,false);
      pEVar17 = CreateAssignment(ctx,source_00,pEVar17,value);
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar21 = (ExprBase *)CONCAT44(extraout_var_03,iVar9);
      pTVar27 = ctx->typeVoid;
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var16 = (_func_int **)CONCAT44(extraout_var_04,iVar9);
      *pp_Var16 = (_func_int *)0x0;
      pp_Var16[1] = (_func_int *)pVVar15;
      pp_Var16[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var16 + 3) = 0;
      pEVar21->typeID = 0x1e;
      pEVar21->source = source_00;
      pEVar21->type = pTVar27;
      pEVar21->next = (ExprBase *)0x0;
      pEVar21->listed = false;
      pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a48;
      pEVar21[1]._vptr_ExprBase = pp_Var16;
      *(ExprBase **)&pEVar21[1].typeID = pEVar17;
      pEVar17 = CreateVariableAccess(ctx,source_00,pVVar15,false);
      pEVar17 = CreateGetAddress(ctx,source_00,pEVar17);
      pEVar24 = (ExprGetAddress *)CreateSequence(ctx,source,pEVar21,pEVar17);
    }
  }
  else {
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar13 = (ExprGetAddress *)CONCAT44(extraout_var,iVar9);
    pTVar27 = (TypeBase *)pTVar27[1]._vptr_TypeBase;
    (pEVar13->super_ExprBase).typeID = 0x16;
    (pEVar13->super_ExprBase).source = source;
    (pEVar13->super_ExprBase).type = pTVar27;
    (pEVar13->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar13->super_ExprBase).listed = false;
    (pEVar13->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
    pEVar13->variable = (VariableHandle *)value;
    pEVar14 = pEVar13;
    if ((pTVar27 != (TypeBase *)0x0) && (pTVar27->typeID == 0x12)) {
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar14 = (ExprGetAddress *)CONCAT44(extraout_var_00,iVar9);
      pTVar27 = (TypeBase *)((IntrusiveList<TypeHandle> *)(pTVar27 + 1))->head;
      (pEVar14->super_ExprBase).typeID = 0x16;
      (pEVar14->super_ExprBase).source = source;
      (pEVar14->super_ExprBase).type = pTVar27;
      (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar14->super_ExprBase).listed = false;
      (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
      pEVar14->variable = (VariableHandle *)pEVar13;
      pEVar24 = pEVar13;
    }
  }
  value = &pEVar14->super_ExprBase;
  if (member == (SynIdentifier *)0x0) {
LAB_0016b627:
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar17 = (ExprBase *)CONCAT44(extraout_var_06,iVar9);
    pTVar27 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar17->typeID = 0x1a;
    pEVar17->source = source;
    pEVar17->type = pTVar27;
    pEVar17->next = (ExprBase *)0x0;
    pEVar17->listed = false;
    pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240c78;
    *(ExprBase **)(pEVar17 + 1) = value;
    *(undefined8 *)&pEVar17[1].typeID = 0;
    return pEVar17;
  }
  pTVar27 = (pEVar14->super_ExprBase).type;
  if ((pTVar27 != (TypeBase *)0x0) && (pTVar27->typeID == 0x13)) {
    local_348 = (undefined1  [8])0x205f0d;
    local_340 = (FunctionData *)0x205f11;
    bVar8 = InplaceStr::operator==(&member->name,(InplaceStr *)local_348);
    if (bVar8) {
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar17 = (ExprBase *)CONCAT44(extraout_var_05,iVar9);
      pTVar18 = ctx->typeInt;
      uVar1 = ((IntrusiveList<TypeHandle> *)&pTVar27[1].typeID)->head;
      pEVar17->typeID = 6;
      pEVar17->source = source;
      pEVar17->type = pTVar18;
      pEVar17->next = (ExprBase *)0x0;
      pEVar17->listed = false;
      pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
      pEVar17[1]._vptr_ExprBase = uVar1;
      return pEVar17;
    }
  }
  pTVar27 = (pEVar24->super_ExprBase).type;
  if ((pTVar27 == (TypeBase *)0x0) || (pTVar27->typeID != 0x12)) {
    pcVar7 = (member->name).begin;
    pTVar27 = (pEVar14->super_ExprBase).type;
    iVar9 = (int)(pTVar27->name).begin;
    anon_unknown.dwarf_c3752::Stop
              (ctx,source,"ERROR: can\'t access member \'%.*s\' of type \'%.*s\'",
               (ulong)(uint)(*(int *)&(member->name).end - (int)pcVar7),pcVar7,
               (ulong)(uint)(*(int *)&(pTVar27->name).end - iVar9),iVar9);
  }
  if (((pEVar14->super_ExprBase).typeID == 8) &&
     (pEVar17 = CreateTypeidMemberAccess(ctx,source,(TypeBase *)pEVar14->variable,member),
     pEVar17 != (ExprBase *)0x0)) {
    return pEVar17;
  }
  parent = (TypeClass *)(pEVar14->super_ExprBase).type;
  if (parent == (TypeClass *)0x0) {
    if (ctx->typeAutoRef == (TypeStruct *)0x0) goto LAB_0016b74b;
  }
  else {
    uVar11 = (parent->super_TypeStruct).super_TypeBase.typeID;
    if ((uVar11 < 0x1a) && ((0x3130000U >> (uVar11 & 0x1f) & 1) != 0)) {
      lVar30 = (long)((IntrusiveList<TypeHandle> *)&(parent->super_TypeStruct).members)->head;
      if (lVar30 != 0) {
        do {
          bVar8 = InplaceStr::operator==
                            ((InplaceStr *)(*(long *)(*(long *)(lVar30 + 8) + 0x28) + 0x40),
                             &member->name);
          if (bVar8) {
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            lVar19 = CONCAT44(extraout_var_07,iVar9);
            pTVar23 = ExpressionContext::GetReferenceType
                                (ctx,*(TypeBase **)(*(long *)(lVar30 + 8) + 0x20));
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            lVar20 = CONCAT44(extraout_var_08,iVar9);
            uVar1 = *(undefined8 *)(lVar30 + 8);
            *(SynIdentifier **)lVar20 = member;
            *(undefined8 *)(lVar20 + 8) = uVar1;
            *(undefined8 *)(lVar20 + 0x10) = 0;
            *(undefined1 *)(lVar20 + 0x18) = 0;
            *(undefined4 *)(lVar19 + 8) = 0x1a;
            *(SynBase **)(lVar19 + 0x10) = source;
            *(TypeRef **)(lVar19 + 0x18) = pTVar23;
            *(undefined8 *)(lVar19 + 0x20) = 0;
            *(undefined1 *)(lVar19 + 0x28) = 0;
            *(undefined ***)lVar19 = &PTR__ExprBase_00240c78;
            *(ExprGetAddress **)(lVar19 + 0x30) = pEVar24;
            *(long *)(lVar19 + 0x38) = lVar20;
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar17 = (ExprBase *)CONCAT44(extraout_var_09,iVar9);
            lVar30 = *(long *)(lVar30 + 8);
            pTVar27 = *(TypeBase **)(lVar30 + 0x20);
            pEVar17->typeID = 0x16;
            pEVar17->source = source;
            pEVar17->type = pTVar27;
            pEVar17->next = (ExprBase *)0x0;
            pEVar17->listed = false;
            pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
            *(long *)(pEVar17 + 1) = lVar19;
            if (*(char *)(lVar30 + 0x35) != '\x01') {
              return pEVar17;
            }
            iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            ExprPassthrough::ExprPassthrough
                      ((ExprPassthrough *)CONCAT44(extraout_var_10,iVar9),pEVar17->source,
                       pEVar17->type,pEVar17);
            return &((ExprPassthrough *)CONCAT44(extraout_var_10,iVar9))->super_ExprBase;
          }
          lVar30 = *(long *)(lVar30 + 0x18);
        } while (lVar30 != 0);
      }
      plVar31 = *(long **)&(parent->super_TypeStruct).constants;
      if (plVar31 != (long *)0x0) {
        do {
          bVar8 = InplaceStr::operator==((InplaceStr *)(*plVar31 + 0x40),&member->name);
          if (bVar8) {
            pEVar17 = CreateLiteralCopy(ctx,source,(ExprBase *)plVar31[1]);
            return pEVar17;
          }
          plVar31 = (long *)plVar31[2];
        } while (plVar31 != (long *)0x0);
      }
      parent = (TypeClass *)(pEVar14->super_ExprBase).type;
    }
    if (parent == (TypeClass *)ctx->typeAutoRef) {
LAB_0016b74b:
      pEVar17 = CreateAutoRefFunctionSet(ctx,source,&pEVar14->super_ExprBase,member->name);
      return pEVar17;
    }
    if ((((parent != (TypeClass *)0x0) && ((parent->super_TypeStruct).super_TypeBase.typeID == 0x18)
         ) && ((parent->baseClass != (TypeClass *)0x0 || (parent->extendable == true)))) &&
       (pEVar17 = CreateVirtualFunctionSet(ctx,source,&pEVar24->super_ExprBase,member->name,parent),
       pEVar17 != (ExprBase *)0x0)) {
      return pEVar17;
    }
  }
  uVar11 = NULLC::GetStringHash((member->name).begin,(member->name).end);
  pTVar18 = anon_unknown.dwarf_c3752::LookupTypeByName
                      ((anon_unknown_dwarf_c3752 *)ctx->scope,
                       (ExpressionContext *)ctx->lookupLocation,uVar11);
  pTVar27 = (pEVar14->super_ExprBase).type;
  bVar8 = false;
  if ((pTVar18 != (TypeBase *)0x0) && (bVar8 = false, pTVar18 == pTVar27)) {
    bVar8 = InplaceStr::operator==(&pTVar18->name,&member->name);
    bVar8 = !bVar8;
    pTVar27 = (pEVar14->super_ExprBase).type;
  }
  uVar11 = NULLC::StringHashContinue(pTVar27->nameHash,"::");
  uVar11 = NULLC::StringHashContinue(uVar11,(member->name).begin,(member->name).end);
  anon_unknown.dwarf_c3752::LookupFunctionChainByName(&local_3f8,ctx,uVar11);
  if (local_3f8.node.node == (Node *)0x0) {
    pEVar17 = (ExprBase *)0x0;
  }
  else {
    chain.node.node = local_3f8.node.node;
    chain.node.start = local_3f8.node.start;
    chain.scope = local_3f8.scope;
    pEVar17 = CreateFunctionAccess(ctx,source,chain,&pEVar24->super_ExprBase);
  }
  if (pEVar17 == (ExprBase *)0x0 && !(bool)(bVar8 ^ 1U)) {
    pEVar17 = CreateConstructorAccess
                        (ctx,source,(pEVar14->super_ExprBase).type,false,&pEVar24->super_ExprBase);
  }
  pTVar27 = (pEVar14->super_ExprBase).type;
  if (pEVar17 == (ExprBase *)0x0) {
    if (pTVar27 != (TypeBase *)0x0) {
      if (pTVar27->typeID == 0x13) {
        pTVar22 = ExpressionContext::GetUnsizedArrayType
                            (ctx,(TypeBase *)((IntrusiveList<TypeHandle> *)(pTVar27 + 1))->head);
        uVar12 = NULLC::StringHashContinue((pTVar22->super_TypeStruct).super_TypeBase.nameHash,"::")
        ;
        uVar12 = NULLC::StringHashContinue(uVar12,(member->name).begin,(member->name).end);
        anon_unknown.dwarf_c3752::LookupFunctionChainByName(&local_410,ctx,uVar12);
        if (local_410.node.node != (Node *)0x0) {
          pTVar23 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pTVar22);
          pEVar17 = CreateCast(ctx,source,&pEVar24->super_ExprBase,&pTVar23->super_TypeBase,false);
          chain_00.node.node = local_410.node.node;
          chain_00.node.start = local_410.node.start;
          chain_00.scope = local_410.scope;
          pEVar17 = CreateFunctionAccess(ctx,source,chain_00,pEVar17);
          return pEVar17;
        }
        pTVar27 = (pEVar14->super_ExprBase).type;
        goto LAB_0016b8ab;
      }
      goto LAB_0016b96f;
    }
  }
  else {
LAB_0016b8ab:
    if (pTVar27 != (TypeBase *)0x0) {
LAB_0016b96f:
      if ((pTVar27->typeID == 0x18) &&
         (pTVar27 = *(TypeBase **)&pTVar27[2].typeIndex, pTVar27 != (TypeBase *)0x0)) {
        uVar12 = NULLC::StringHashContinue(pTVar27->nameHash,"::");
        uVar12 = NULLC::StringHashContinue(uVar12,(member->name).begin,(member->name).end);
        anon_unknown.dwarf_c3752::LookupFunctionChainByName(&local_428,ctx,uVar12);
        if (local_428.node.node == (Node *)0x0) {
          pEVar21 = (ExprBase *)0x0;
        }
        else {
          chain_01.node.node = local_428.node.node;
          chain_01.node.start = local_428.node.start;
          chain_01.scope = local_428.scope;
          pEVar21 = CreateFunctionAccess(ctx,source,chain_01,&pEVar24->super_ExprBase);
        }
        if (!(bool)(bVar8 ^ 1U) && pEVar21 == (ExprBase *)0x0) {
          pEVar21 = CreateConstructorAccess(ctx,source,pTVar27,false,&pEVar24->super_ExprBase);
        }
        if ((pEVar17 != (ExprBase *)0x0) && (pEVar21 != (ExprBase *)0x0)) {
          pAVar2 = ctx->allocator;
          local_3e0.data = local_3e0.little;
          local_3e0.count = 0;
          local_3e0.max = 0x10;
          local_488.head = (FunctionHandle *)0x0;
          local_488.tail = (FunctionHandle *)0x0;
          local_3e0.allocator = pAVar2;
          memset(local_338,0,0x300);
          local_340 = (FunctionData *)0x2000000000;
          local_348 = (undefined1  [8])local_338;
          local_38 = pAVar2;
          GetNodeFunctions(ctx,source,pEVar17,(SmallArray<FunctionValue,_32U> *)local_348);
          GetNodeFunctions(ctx,source,pEVar21,(SmallArray<FunctionValue,_32U> *)local_348);
          if ((uint)local_340 != 0) {
            uVar29 = 0;
            uVar11 = (uint)local_340;
            do {
              pFVar3 = *(FunctionData **)((uint *)((long)local_348 + 8) + uVar29 * 6);
              pTVar4 = pFVar3->type;
              if (local_488.head == (FunctionHandle *)0x0) {
LAB_0016bd26:
                if (local_3e0.count == local_3e0.max) {
                  SmallArray<TypeBase_*,_16U>::grow(&local_3e0,local_3e0.count);
                }
                if (local_3e0.data == (TypeBase **)0x0) {
                  __assert_fail("data",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                ,0x162,
                                "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                               );
                }
                uVar28 = (ulong)local_3e0.count;
                local_3e0.count = local_3e0.count + 1;
                local_3e0.data[uVar28] = &pTVar4->super_TypeBase;
                iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
                pFVar25 = (FunctionHandle *)CONCAT44(extraout_var_12,iVar9);
                pFVar25->function = pFVar3;
                pFVar25->next = (FunctionHandle *)0x0;
                pFVar25->listed = false;
                IntrusiveList<FunctionHandle>::push_back(&local_488,pFVar25);
                uVar11 = (uint)local_340;
              }
              else {
                pFVar25 = local_488.head;
LAB_0016bcc8:
                do {
                  pTVar5 = (pFVar25->function->type->arguments).head;
                  for (pTVar6 = (pTVar4->arguments).head;
                      (pTVar5 != (TypeHandle *)0x0 && (pTVar6 != (TypeHandle *)0x0));
                      pTVar6 = pTVar6->next) {
                    if (pTVar5->type != pTVar6->type) {
                      pFVar25 = pFVar25->next;
                      if (pFVar25 == (FunctionHandle *)0x0) goto LAB_0016bd26;
                      goto LAB_0016bcc8;
                    }
                    pTVar5 = pTVar5->next;
                  }
                  pFVar25 = pFVar25->next;
                } while ((pFVar25 != (FunctionHandle *)0x0) && (pTVar5 != pTVar6));
                if (pTVar5 != pTVar6) goto LAB_0016bd26;
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 < uVar11);
          }
          setTypes.count = local_3e0.count;
          setTypes.data = local_3e0.data;
          setTypes._12_4_ = 0;
          pTVar26 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pEVar17 = (ExprBase *)CONCAT44(extraout_var_13,iVar9);
          pEVar17->typeID = 0x27;
          pEVar17->source = source;
          pEVar17->type = &pTVar26->super_TypeBase;
          pEVar17->next = (ExprBase *)0x0;
          pEVar17->listed = false;
          pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240e70;
          *(FunctionHandle **)(pEVar17 + 1) = local_488.head;
          *(FunctionHandle **)&pEVar17[1].typeID = local_488.tail;
          pEVar17[1].source = (SynBase *)pEVar24;
          SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_348);
          SmallArray<TypeBase_*,_16U>::~SmallArray(&local_3e0);
          return pEVar17;
        }
        if (pEVar17 != (ExprBase *)0x0) {
          return pEVar17;
        }
        if (pEVar21 != (ExprBase *)0x0) {
          if (pEVar21->typeID != 0x26) {
            return pEVar21;
          }
          lVar30 = *(long *)(*(long *)(*(long *)(pEVar21 + 1) + 0x18) + 0x20);
          if (lVar30 == 0) {
            return pEVar21;
          }
          if (*(char *)(lVar30 + 0x3c) != '\x01') {
            return pEVar21;
          }
          pTVar4 = *(TypeFunction **)(*(long *)(pEVar21 + 1) + 0x28);
          if ((pTVar4->super_TypeBase).isGeneric != false) {
            return pEVar21;
          }
          GetFunctionForType((FunctionValue *)local_348,ctx,source,pEVar21,pTVar4);
          pFVar3 = local_340;
          if (local_340 == (FunctionData *)0x0) {
            return pEVar21;
          }
          iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          ExprFunctionAccess::ExprFunctionAccess
                    ((ExprFunctionAccess *)CONCAT44(extraout_var_14,iVar9),(SynBase *)local_348,
                     &pFVar3->type->super_TypeBase,pFVar3,(ExprBase *)local_338[0]._vptr_SynBase);
          return &((ExprFunctionAccess *)CONCAT44(extraout_var_14,iVar9))->super_ExprBase;
        }
        goto LAB_0016ba04;
      }
    }
    if (pEVar17 != (ExprBase *)0x0) {
      return pEVar17;
    }
  }
LAB_0016ba04:
  uVar11 = NULLC::StringHashContinue(uVar11,"$");
  anon_unknown.dwarf_c3752::LookupFunctionChainByName(&local_440,ctx,uVar11);
  if ((local_440.node.node != (Node *)0x0) &&
     (chain_02.node.node = local_440.node.node, chain_02.node.start = local_440.node.start,
     chain_02.scope = local_440.scope,
     pEVar17 = CreateFunctionAccess(ctx,source,chain_02,&pEVar24->super_ExprBase),
     pEVar17 != (ExprBase *)0x0)) {
LAB_0016ba69:
    pEVar17 = CreateFunctionCall(ctx,source,pEVar17,(IntrusiveList<TypeHandle>)ZEXT816(0),
                                 (SynCallArgument *)0x0,false);
    pTVar27 = pEVar17->type;
    if (pTVar27 == (TypeBase *)0x0) {
      return pEVar17;
    }
    if (pTVar27->typeID != 0x12) {
      return pEVar17;
    }
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar21 = (ExprBase *)CONCAT44(extraout_var_11,iVar9);
    pTVar27 = (TypeBase *)((IntrusiveList<TypeHandle> *)(pTVar27 + 1))->head;
    pEVar21->typeID = 0x16;
    pEVar21->source = source;
    pEVar21->type = pTVar27;
    pEVar21->next = (ExprBase *)0x0;
    pEVar21->listed = false;
    pEVar21->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240a80;
    *(ExprBase **)(pEVar21 + 1) = pEVar17;
    return pEVar21;
  }
  pTVar27 = (pEVar14->super_ExprBase).type;
  if (pTVar27 != (TypeBase *)0x0) {
    if (pTVar27->typeID == 0x13) {
      pTVar22 = ExpressionContext::GetUnsizedArrayType
                          (ctx,(TypeBase *)((IntrusiveList<TypeHandle> *)(pTVar27 + 1))->head);
      uVar11 = NULLC::StringHashContinue((pTVar22->super_TypeStruct).super_TypeBase.nameHash,"::");
      uVar11 = NULLC::StringHashContinue(uVar11,(member->name).begin,(member->name).end);
      anon_unknown.dwarf_c3752::LookupFunctionChainByName(&local_458,ctx,uVar11);
      if (local_458.node.node != (Node *)0x0) {
        pTVar23 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pTVar22);
        pEVar24 = (ExprGetAddress *)
                  CreateCast(ctx,source,&pEVar24->super_ExprBase,&pTVar23->super_TypeBase,false);
        chain_03.node.node = local_458.node.node;
        chain_03.node.start = local_458.node.start;
        chain_03.scope = local_458.scope;
        pEVar17 = CreateFunctionAccess(ctx,source,chain_03,(ExprBase *)pEVar24);
        if (pEVar17 != (ExprBase *)0x0) goto LAB_0016ba69;
      }
    }
    pTVar27 = (pEVar14->super_ExprBase).type;
    if (((pTVar27 != (TypeBase *)0x0) && (pTVar27->typeID == 0x18)) &&
       (*(long *)&pTVar27[2].typeIndex != 0)) {
      uVar11 = NULLC::StringHashContinue(*(uint *)(*(long *)&pTVar27[2].typeIndex + 0xc),"::");
      uVar11 = NULLC::StringHashContinue(uVar11,(member->name).begin,(member->name).end);
      uVar11 = NULLC::StringHashContinue(uVar11,"$");
      anon_unknown.dwarf_c3752::LookupFunctionChainByName(&local_470,ctx,uVar11);
      if (local_470.node.node != (Node *)0x0) {
        chain_04.node.node = local_470.node.node;
        chain_04.node.start = local_470.node.start;
        chain_04.scope = local_470.scope;
        pEVar17 = CreateFunctionAccess(ctx,source,chain_04,&pEVar24->super_ExprBase);
        goto LAB_0016ba69;
      }
    }
  }
  if (allowFailure) {
    return (ExprBase *)0x0;
  }
  pcVar7 = (member->name).begin;
  pTVar27 = (pEVar14->super_ExprBase).type;
  iVar9 = (int)(pTVar27->name).begin;
  anon_unknown.dwarf_c3752::Report
            (ctx,source,
             "ERROR: member variable or function \'%.*s\' is not defined in class \'%.*s\'",
             (ulong)(uint)(*(int *)&(member->name).end - (int)pcVar7),pcVar7,
             (ulong)(uint)(*(int *)&(pTVar27->name).end - iVar9),iVar9);
  iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar17 = (ExprBase *)CONCAT44(extraout_var_15,iVar9);
  pTVar27 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  pEVar17->typeID = 0x1a;
  pEVar17->source = source;
  pEVar17->type = pTVar27;
  pEVar17->next = (ExprBase *)0x0;
  pEVar17->listed = false;
  pEVar17->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240c78;
  *(ExprGetAddress **)(pEVar17 + 1) = pEVar14;
  *(undefined8 *)&pEVar17[1].typeID = 0;
  return pEVar17;
}

Assistant:

ExprBase* CreateMemberAccess(ExpressionContext &ctx, SynBase *source, ExprBase *value, SynIdentifier *member, bool allowFailure)
{
	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(TypeRef *refType = getType<TypeRef>(value->type))
		{
			wrapped = value;

			value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);
		}
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(!member)
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);

	if(TypeArray *node = getType<TypeArray>(value->type))
	{
		if(member->name == InplaceStr("size"))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, node->length);
	}

	if(isType<TypeRef>(wrapped->type))
	{
		if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(value))
		{
			if(ExprBase *result = CreateTypeidMemberAccess(ctx, source, node->value, member))
				return result;
		}

		if(TypeStruct *node = getType<TypeStruct>(value->type))
		{
			// Search for a member variable
			for(MemberHandle *el = node->members.head; el; el = el->next)
			{
				if(el->variable->name->name == member->name)
				{
					// Member access only shifts an address, so we are left with a reference to get value from
					ExprMemberAccess *shift = new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetReferenceType(el->variable->type), wrapped, new (ctx.get<VariableHandle>()) VariableHandle(member, el->variable));

					ExprBase *memberValue = new (ctx.get<ExprDereference>()) ExprDereference(source, el->variable->type, shift);

					if(el->variable->isReadonly)
						return new (ctx.get<ExprPassthrough>()) ExprPassthrough(memberValue->source, memberValue->type, memberValue);

					return memberValue;
				}
			}

			// Search for a member constant
			for(ConstantData *curr = node->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == member->name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}

		if(value->type == ctx.typeAutoRef)
			return CreateAutoRefFunctionSet(ctx, source, value, member->name);

		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(classType->baseClass != NULL || classType->extendable)
			{
				if(ExprBase *overloads = CreateVirtualFunctionSet(ctx, source, wrapped, member->name, classType))
					return overloads;
			}
		}

		// Check if a name resembles a type alias of the value class
		TypeBase *aliasType = NULL;

		if(TypeBase *type = LookupTypeByName(ctx, member->name.hash()))
		{
			if(type == value->type && type->name != member->name)
			{
				if(TypeClass *typeClass = getType<TypeClass>(type))
				{
					if(typeClass->proto)
						type = typeClass->proto;
				}

				aliasType = type;
			}
		}

		// Look for a member function
		ExprBase *mainFuncton = NULL;

		unsigned hash = NULLC::StringHashContinue(value->type->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			mainFuncton = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!mainFuncton && aliasType)
			mainFuncton = CreateConstructorAccess(ctx, source, value->type, false, wrapped);

		if(!mainFuncton)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					return CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		ExprBase *baseFunction = NULL;

		// Look for a member function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
					baseFunction = CreateFunctionAccess(ctx, source, function, wrapped);

				if(!baseFunction && aliasType)
					baseFunction = CreateConstructorAccess(ctx, source, protoType, false, wrapped);
			}
		}

		// Add together instantiated and generic base functions
		if(mainFuncton && baseFunction)
		{
			SmallArray<TypeBase*, 16> types(ctx.allocator);
			IntrusiveList<FunctionHandle> overloads;

			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, mainFuncton, functions);
			GetNodeFunctions(ctx, source, baseFunction, functions);

			for(unsigned i = 0; i < functions.size(); i++)
			{
				FunctionValue function = functions[i];

				bool instantiated = false;

				for(FunctionHandle *curr = overloads.head; curr && !instantiated; curr = curr->next)
				{
					if(SameArguments(curr->function->type, function.function->type))
						instantiated = true;
				}

				if(instantiated)
					continue;

				types.push_back(function.function->type);
				overloads.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function.function));
			}

			TypeFunctionSet *type = ctx.GetFunctionSetType(types);

			return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, overloads, wrapped);
		}

		if(mainFuncton)
			return mainFuncton;

		if(baseFunction)
		{
			if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(baseFunction))
			{
				if(node->function->scope->ownerType && node->function->scope->ownerType->isGeneric && !node->function->type->isGeneric)
				{
					if(FunctionValue bestOverload = GetFunctionForType(ctx, source, baseFunction, node->function->type))
						return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
				}
			}

			return baseFunction;
		}

		// Look for an accessor
		hash = NULLC::StringHashContinue(hash, "$");

		ExprBase *access = NULL;

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
			access = CreateFunctionAccess(ctx, source, function, wrapped);

		if(!access)
		{
			if(TypeArray *node = getType<TypeArray>(value->type))
			{
				TypeUnsizedArray *arrayType = ctx.GetUnsizedArrayType(node->subType);

				unsigned hash = NULLC::StringHashContinue(arrayType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					wrapped = CreateCast(ctx, source, wrapped, ctx.GetReferenceType(arrayType), false);

					access = CreateFunctionAccess(ctx, source, function, wrapped);
				}
			}
		}

		if(access)
		{
			ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);;

			if(TypeRef *refType = getType<TypeRef>(call->type))
				return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

			return call;
		}

		// Look for an accessor function in a generic class base
		if(TypeClass *classType = getType<TypeClass>(value->type))
		{
			if(TypeGenericClassProto *protoType = classType->proto)
			{
				unsigned hash = NULLC::StringHashContinue(protoType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, member->name.begin, member->name.end);

				// Look for an accessor
				hash = NULLC::StringHashContinue(hash, "$");

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, hash))
				{
					ExprBase *access = CreateFunctionAccess(ctx, source, function, wrapped);

					ExprBase *call = CreateFunctionCall(ctx, source, access, IntrusiveList<TypeHandle>(), NULL, false);

					if(TypeRef *refType = getType<TypeRef>(call->type))
						return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, call);

					return call;
				}
			}
		}

		if(allowFailure)
			return NULL;

		Report(ctx, source, "ERROR: member variable or function '%.*s' is not defined in class '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(source, ctx.GetErrorType(), value, NULL);
	}

	Stop(ctx, source, "ERROR: can't access member '%.*s' of type '%.*s'", FMT_ISTR(member->name), FMT_ISTR(value->type->name));

	return NULL;
}